

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalPhraseStart(Fts3Cursor *pCsr,int bOptOk,Fts3Phrase *p)

{
  int nTerm;
  uint uVar1;
  Fts3MultiSegReader *pFVar2;
  char *zTerm;
  bool bVar3;
  int iVar4;
  Fts3MultiSegReader **ppFVar5;
  ulong uVar6;
  code *xCmp;
  long lVar7;
  int iToken;
  Fts3Table *p_00;
  Fts3Table *pTab;
  ulong uVar8;
  Fts3PhraseToken *pTok;
  bool bVar9;
  int nThis;
  Fts3PhraseToken *local_68;
  long local_60;
  int local_54;
  undefined8 local_50;
  Fts3Table *local_48;
  char *local_40;
  Fts3Phrase *local_38;
  
  p_00 = (Fts3Table *)(pCsr->base).pVtab;
  bVar3 = false;
  bVar9 = false;
  if (((bOptOk != 0) && (pCsr->bDesc == p_00->bDescIdx)) && (p->nToken < 5)) {
    bVar9 = 0 < p->nToken;
  }
  pTok = p->aToken;
  ppFVar5 = &p->aToken[0].pSegcsr;
  lVar7 = 0;
  do {
    if (!bVar9) {
LAB_001a7610:
      local_50 = 0;
      iVar4 = 0;
      for (lVar7 = 0; (iVar4 == 0 && (lVar7 < p->nToken)); lVar7 = lVar7 + 1) {
        if (pTok->pSegcsr == (Fts3MultiSegReader *)0x0) {
          iVar4 = 0;
        }
        else {
          nThis = 0;
          local_40 = (char *)0x0;
          iVar4 = fts3TermSelect(p_00,pTok,p->iColumn,&nThis,&local_40);
          if (iVar4 == 0) {
            iVar4 = fts3EvalPhraseMergeToken(p_00,p,(int)lVar7,local_40,nThis);
          }
        }
        pTok = pTok + 1;
      }
LAB_001a768b:
      p->bIncr = (int)local_50;
      return iVar4;
    }
    if (p->nToken <= lVar7) {
      if (bVar3) {
        local_54 = -1;
        if (p->iColumn < p_00->nColumn) {
          local_54 = p->iColumn;
        }
        local_50 = 1;
        iVar4 = 0;
        local_68 = pTok;
        local_48 = p_00;
        local_38 = p;
        for (local_60 = 0; (iVar4 == 0 && (local_60 < p->nToken)); local_60 = local_60 + 1) {
          pFVar2 = pTok[local_60].pSegcsr;
          iVar4 = 0;
          if (pFVar2 != (Fts3MultiSegReader *)0x0) {
            zTerm = pTok[local_60].z;
            nTerm = pTok[local_60].n;
            uVar1 = pFVar2->nSegment;
            xCmp = fts3SegReaderDoclistCmpRev;
            if (p_00->bDescIdx == '\0') {
              xCmp = fts3SegReaderDoclistCmp;
            }
            iVar4 = fts3SegReaderStart(p_00,pFVar2,zTerm,nTerm);
            p_00 = local_48;
            pTok = local_68;
            if (iVar4 == 0) {
              if ((int)uVar1 < 1) {
                uVar1 = 0;
              }
              uVar8 = (ulong)uVar1;
              for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
                if (pFVar2->apSegment[uVar6]->aNode == (char *)0x0) {
                  uVar8 = uVar6 & 0xffffffff;
                  break;
                }
                iVar4 = fts3SegReaderTermCmp(pFVar2->apSegment[uVar6],zTerm,nTerm);
                if (iVar4 != 0) {
                  uVar8 = uVar6 & 0xffffffff;
                  break;
                }
              }
              p = local_38;
              p_00 = local_48;
              pFVar2->nAdvance = (int)uVar8;
              for (lVar7 = 0; lVar7 < (int)uVar8; lVar7 = lVar7 + 1) {
                iVar4 = fts3SegReaderFirstDocid(p_00,pFVar2->apSegment[lVar7]);
                pTok = local_68;
                if (iVar4 != 0) goto LAB_001a7608;
                uVar8 = (ulong)(uint)pFVar2->nAdvance;
              }
              fts3SegReaderSort(pFVar2->apSegment,(int)lVar7,(int)lVar7,xCmp);
              pFVar2->iColFilter = local_54;
              iVar4 = 0;
              pTok = local_68;
            }
          }
LAB_001a7608:
        }
        goto LAB_001a768b;
      }
      goto LAB_001a7610;
    }
    pFVar2 = *ppFVar5;
    if (*(int *)(ppFVar5 + -2) == 0) {
      bVar9 = true;
      if (pFVar2 != (Fts3MultiSegReader *)0x0) {
        bVar9 = pFVar2->bLookup != 0;
        bVar3 = true;
      }
    }
    else {
      if (pFVar2 != (Fts3MultiSegReader *)0x0) {
        bVar3 = true;
      }
      bVar9 = false;
    }
    lVar7 = lVar7 + 1;
    ppFVar5 = ppFVar5 + 5;
  } while( true );
}

Assistant:

static int fts3EvalPhraseStart(Fts3Cursor *pCsr, int bOptOk, Fts3Phrase *p){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int rc = SQLITE_OK;             /* Error code */
  int i;

  /* Determine if doclists may be loaded from disk incrementally. This is
  ** possible if the bOptOk argument is true, the FTS doclists will be
  ** scanned in forward order, and the phrase consists of 
  ** MAX_INCR_PHRASE_TOKENS or fewer tokens, none of which are are "^first"
  ** tokens or prefix tokens that cannot use a prefix-index.  */
  int bHaveIncr = 0;
  int bIncrOk = (bOptOk 
   && pCsr->bDesc==pTab->bDescIdx 
   && p->nToken<=MAX_INCR_PHRASE_TOKENS && p->nToken>0
#ifdef SQLITE_TEST
   && pTab->bNoIncrDoclist==0
#endif
  );
  for(i=0; bIncrOk==1 && i<p->nToken; i++){
    Fts3PhraseToken *pToken = &p->aToken[i];
    if( pToken->bFirst || (pToken->pSegcsr!=0 && !pToken->pSegcsr->bLookup) ){
      bIncrOk = 0;
    }
    if( pToken->pSegcsr ) bHaveIncr = 1;
  }

  if( bIncrOk && bHaveIncr ){
    /* Use the incremental approach. */
    int iCol = (p->iColumn >= pTab->nColumn ? -1 : p->iColumn);
    for(i=0; rc==SQLITE_OK && i<p->nToken; i++){
      Fts3PhraseToken *pToken = &p->aToken[i];
      Fts3MultiSegReader *pSegcsr = pToken->pSegcsr;
      if( pSegcsr ){
        rc = sqlite3Fts3MsrIncrStart(pTab, pSegcsr, iCol, pToken->z, pToken->n);
      }
    }
    p->bIncr = 1;
  }else{
    /* Load the full doclist for the phrase into memory. */
    rc = fts3EvalPhraseLoad(pCsr, p);
    p->bIncr = 0;
  }

  assert( rc!=SQLITE_OK || p->nToken<1 || p->aToken[0].pSegcsr==0 || p->bIncr );
  return rc;
}